

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

uint __thiscall
TArray<sector_t,_sector_t>::Push(TArray<sector_t,_sector_t> *this,sector_t_conflict *item)

{
  uint uVar1;
  
  Grow(this,1);
  sector_t::sector_t((sector_t *)(this->Array + this->Count),item);
  uVar1 = this->Count;
  this->Count = uVar1 + 1;
  return uVar1;
}

Assistant:

unsigned int Push (const T &item)
	{
		Grow (1);
		::new((void*)&Array[Count]) T(item);
		return Count++;
	}